

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.hpp
# Opt level: O1

ostream * cpp_bindgen::_impl::write_fortran_binding<void(bindgen_fortran_array_descriptor*)>
                    (ostream *strm,char *c_name,char *fortran_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  ostream *poVar4;
  size_t sVar5;
  long *plVar6;
  size_type *psVar7;
  long lVar8;
  char *pcVar9;
  int count;
  stringstream tmp_strm;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  paVar1 = &local_218.field_2;
  local_218.field_2._M_allocated_capacity = 0x6974756f72627573;
  local_218._M_string_length = 10;
  local_218.field_2._8_3_ = 0x656e;
  local_218._M_dataplus._M_p = (pointer)paVar1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,paVar1->_M_local_buf,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  if (fortran_name == (char *)0x0) {
    std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
  }
  else {
    sVar5 = strlen(fortran_name);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,fortran_name,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  local_218.field_2._M_allocated_capacity = (size_type)&local_1f8;
  local_1f8._M_dataplus._M_p = (pointer)((ulong)local_1f8._M_dataplus._M_p._4_4_ << 0x20);
  local_218._M_string_length = (size_type)local_1b8;
  for_each_param_helper_f<cpp_bindgen::_impl::ignore_type_f,cpp_bindgen::_impl::write_fortran_binding<void(bindgen_fortran_array_descriptor*)>(std::ostream&,char_const*,char_const*)::{lambda(std::__cxx11::string_const&,int)#1}>
  ::operator()((for_each_param_helper_f<cpp_bindgen::_impl::ignore_type_f,cpp_bindgen::_impl::write_fortran_binding<void(bindgen_fortran_array_descriptor*)>(std::ostream&,char_const*,char_const*)::_lambda(std::__cxx11::string_const&,int)_1_>
                *)&local_218);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
  iVar3 = strcmp(c_name,fortran_name);
  if (iVar3 == 0) {
    lVar8 = 8;
    pcVar9 = " bind(c)";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," bind(c, name=\"",0xf);
    if (c_name == (char *)0x0) {
      std::ios::clear((int)(ostream *)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
    }
    else {
      sVar5 = strlen(c_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,c_name,sVar5);
    }
    lVar8 = 2;
    pcVar9 = "\")";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,lVar8);
  std::__cxx11::stringbuf::str();
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"    ","");
  wrap_line(&local_218,&local_1f8,&local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>
            (strm,local_218._M_dataplus._M_p,local_218._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,(ulong)(local_218.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_1f8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(strm,"      use iso_c_binding\n",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            (strm,"      use bindgen_array_descriptor\n",0x23);
  local_1f8._M_dataplus._M_p = local_1f8._M_dataplus._M_p & 0xffffffff00000000;
  local_218._M_string_length = (size_type)strm;
  local_218.field_2._M_allocated_capacity = (size_type)&local_1f8;
  for_each_param_helper_f<cpp_bindgen::_impl::fortran_param_type_from_c_f,cpp_bindgen::_impl::write_fortran_binding<void(bindgen_fortran_array_descriptor*)>(std::ostream&,char_const*,char_const*)::{lambda(std::__cxx11::string_const&,int)#2}>
  ::operator()((for_each_param_helper_f<cpp_bindgen::_impl::fortran_param_type_from_c_f,cpp_bindgen::_impl::write_fortran_binding<void(bindgen_fortran_array_descriptor*)>(std::ostream&,char_const*,char_const*)::_lambda(std::__cxx11::string_const&,int)_2_>
                *)&local_218);
  std::__ostream_insert<char,std::char_traits<char>>(strm,"    end ",8);
  local_1f8.field_2._M_allocated_capacity = 0x6974756f72627573;
  local_1f8.field_2._8_2_ = 0x656e;
  local_1f8._M_string_length = 10;
  local_1f8.field_2._M_local_buf[10] = '\0';
  local_1f8._M_dataplus._M_p = (pointer)paVar2;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_1f8);
  psVar7 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_218.field_2._M_allocated_capacity = *psVar7;
    local_218.field_2._8_8_ = plVar6[3];
    local_218._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_218.field_2._M_allocated_capacity = *psVar7;
    local_218._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_218._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (strm,local_218._M_dataplus._M_p,local_218._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return poVar4;
}

Assistant:

std::ostream &write_fortran_binding(std::ostream &strm, char const *c_name, char const *fortran_name) {
            std::stringstream tmp_strm;
            tmp_strm << fortran_return_type<typename function_traits::result_type<CSignature>::type>() << " "
                     << fortran_name << "(";
            for_each_param<CSignature>(ignore_type_f{}, [&](const std::string &, int i) {
                if (i)
                    tmp_strm << ", ";
                tmp_strm << "arg" << i;
            });
            tmp_strm << ")";
            if (strcmp(c_name, fortran_name) == 0)
                tmp_strm << " bind(c)";
            else
                tmp_strm << " bind(c, name=\"" << c_name << "\")";
            strm << wrap_line(tmp_strm.str(), "    ");
            strm << "      use iso_c_binding\n";
            if (has_array_descriptor<CSignature>::value)
                strm << "      use bindgen_array_descriptor\n";
            for_each_param<CSignature>(fortran_param_type_from_c_f{},
                [&](const std::string &type_name, int i) { strm << "      " << type_name << " :: arg" << i << "\n"; });
            return strm << "    end "
                        << fortran_function_specifier<typename function_traits::result_type<CSignature>::type>() + "\n";
        }